

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_load_module_file(sexp ctx,char *file,sexp env)

{
  sexp psVar1;
  sexp_sint_t n;
  sexp path;
  sexp local_38;
  sexp_gc_var_t local_30;
  
  local_30.var = &local_38;
  local_38 = (sexp)0x43e;
  local_30.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_30;
  local_38 = sexp_find_module_file(ctx,file);
  if ((((ulong)local_38 & 3) == 0) && (local_38->tag == 9)) {
    psVar1 = sexp_load_op(ctx,(sexp)0x0,n,local_38,env);
  }
  else {
    local_38 = sexp_c_string(ctx,file,-1);
    psVar1 = sexp_user_exception(ctx,(sexp)&DAT_0000003e,"couldn\'t find file in module path",
                                 local_38);
  }
  (ctx->value).context.saves = local_30.next;
  return psVar1;
}

Assistant:

sexp sexp_load_module_file (sexp ctx, const char *file, sexp env) {
  sexp res;
  sexp_gc_var1(path);
  sexp_gc_preserve1(ctx, path);
  path = sexp_find_module_file(ctx, file);
  if (sexp_stringp(path)) {
    res = sexp_load(ctx, path, env);
  } else {
    path = sexp_c_string(ctx, file, -1);
    res = sexp_user_exception(ctx, SEXP_FALSE, sexp_file_not_found, path);
  }
  sexp_gc_release1(ctx);
  return res;
}